

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O3

mallinfo * dlmallinfo(void)

{
  mchunkptr pmVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  mallinfo *in_RDI;
  size_t sVar7;
  malloc_segment *pmVar8;
  ulong uVar9;
  mchunkptr pmVar10;
  ulong uVar11;
  
  in_RDI->fordblks = 0;
  in_RDI->keepcost = 0;
  in_RDI->fsmblks = 0;
  in_RDI->uordblks = 0;
  in_RDI->hblkhd = 0;
  in_RDI->usmblks = 0;
  in_RDI->smblks = 0;
  in_RDI->hblks = 0;
  in_RDI->arena = 0;
  in_RDI->ordblks = 0;
  if (mparams.magic == 0) {
    init_mparams();
  }
  iVar3 = _gm_.mutex;
  if (((byte)_gm_.mflags & 2) != 0) {
    uVar5 = 1;
    LOCK();
    _gm_.mutex = 1;
    UNLOCK();
    if (iVar3 != 0) {
      while (_gm_.mutex != 0) {
        if ((uVar5 & 0x3f) == 0) {
          sched_yield();
        }
        uVar5 = uVar5 + 1;
      }
      LOCK();
      _gm_.mutex = 1;
      UNLOCK();
    }
  }
  sVar2 = _gm_.topsize;
  if (_gm_.top != (mchunkptr)0x0) {
    sVar4 = _gm_.topsize + 0x50;
    pmVar8 = &_gm_.seg;
    sVar7 = 1;
    sVar6 = sVar4;
    do {
      pmVar1 = (mchunkptr)pmVar8->base;
      uVar5 = (int)pmVar1 + 0x10;
      uVar9 = (ulong)(-uVar5 & 0xf);
      if ((uVar5 & 0xf) == 0) {
        uVar9 = 0;
      }
      pmVar10 = (mchunkptr)((long)&pmVar1->prev_foot + uVar9);
      do {
        if (((pmVar10 == _gm_.top) ||
            ((mchunkptr)((long)&pmVar1->prev_foot + pmVar8->size) <= pmVar10)) ||
           (uVar9 = pmVar10->head, uVar9 == 0xb)) break;
        uVar11 = uVar9 & 0xfffffffffffffff8;
        sVar4 = sVar4 + uVar11;
        uVar5 = (uint)uVar9 & 3;
        uVar9 = 0;
        if (uVar5 == 1) {
          uVar9 = uVar11;
        }
        sVar6 = sVar6 + uVar9;
        sVar7 = sVar7 + (uVar5 == 1);
        pmVar10 = (mchunkptr)((long)&pmVar10->prev_foot + uVar11);
      } while (pmVar1 <= pmVar10);
      pmVar8 = pmVar8->next;
    } while (pmVar8 != (malloc_segment *)0x0);
    in_RDI->arena = sVar4;
    in_RDI->ordblks = sVar7;
    sVar7 = _gm_.footprint;
    in_RDI->hblkhd = _gm_.footprint - sVar4;
    in_RDI->usmblks = _gm_.max_footprint;
    in_RDI->uordblks = sVar7 - sVar6;
    in_RDI->fordblks = sVar6;
    in_RDI->keepcost = sVar2;
  }
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return in_RDI;
}

Assistant:

struct mallinfo dlmallinfo(void) {
  return internal_mallinfo(gm);
}